

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
::set_empty_key(dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
                *this,key_type *key)

{
  pointer ppcVar1;
  const_pointer in_RSI;
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *in_RDI;
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *unaff_retaddr;
  sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4> *table_start;
  
  table_start = in_RDI;
  sparsehash_internal::sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>::set_use_empty
            (in_RDI,true);
  in_RDI[1].shrink_threshold_ = (size_type)*in_RSI;
  ppcVar1 = Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::allocate
                      ((Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)unaff_retaddr,
                       (size_type)table_start,in_RSI);
  in_RDI[2].shrink_threshold_ = (size_type)ppcVar1;
  fill_range_with_empty(unaff_retaddr,(pointer)table_start,(size_type)in_RSI);
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }